

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobuf.c
# Opt level: O0

void abuf_pull(autobuf *autobuf,size_t len)

{
  size_t sVar1;
  int iVar2;
  char *pcVar3;
  size_t local_28;
  size_t newsize;
  char *p;
  size_t len_local;
  autobuf *autobuf_local;
  
  if ((autobuf != (autobuf *)0x0) && (len != 0)) {
    if (len != autobuf->_len) {
      memmove(autobuf->_buf,autobuf->_buf + len,autobuf->_len - len);
    }
    autobuf->_len = autobuf->_len - len;
    sVar1 = autobuf->_len;
    iVar2 = getpagesize();
    if (sVar1 + (long)iVar2 <= autobuf->_total) {
      iVar2 = getpagesize();
      local_28 = autobuf->_total - (long)iVar2;
      autobuf->_total = local_28;
      iVar2 = getpagesize();
      if (local_28 < (ulong)(long)iVar2) {
        iVar2 = getpagesize();
        local_28 = (size_t)iVar2;
      }
      pcVar3 = (char *)realloc(autobuf->_buf,local_28);
      if (pcVar3 != (char *)0x0) {
        autobuf->_buf = pcVar3;
        autobuf->_total = local_28;
      }
    }
  }
  return;
}

Assistant:

void
abuf_pull(struct autobuf *autobuf, size_t len) {
  char *p;
  size_t newsize;

  if (autobuf == NULL || len == 0)
    return;

  if (len != autobuf->_len) {
    memmove(autobuf->_buf, &autobuf->_buf[len], autobuf->_len - len);
  }
  autobuf->_len -= len;

  if (autobuf->_len + getpagesize() > autobuf->_total) {
    /* only reduce buffer size if difference is larger than a chunk */
    return;
  }
  newsize = autobuf->_total -= getpagesize();
  if (newsize < (size_t)getpagesize()) {
    newsize = getpagesize();
  }

  /* generate smaller buffer */
  p = realloc(autobuf->_buf, newsize);
  if (p == NULL) {
    /* keep the longer buffer if we cannot get a smaller one */
    return;
  }
  autobuf->_buf = p;
  autobuf->_total = newsize;
  return;
}